

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forms_compatability.cxx
# Opt level: O3

void fl_show_form(Fl_Window *f,int place,int b,char *n)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int y;
  int x;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  Fl_Window::label(f,n);
  if (b == 0) {
    puVar1 = &(f->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 8;
  }
  if ((b == 2) || (fl_modal_next != '\0')) {
    pbVar2 = (byte *)((long)&(f->super_Fl_Group).super_Fl_Widget.flags_ + 1);
    *pbVar2 = *pbVar2 | 0x40;
    fl_modal_next = '\0';
  }
  if ((place & 1U) != 0) {
    Fl_Window::hotspot(f,(Fl_Widget *)f,0);
  }
  if ((place & 2U) != 0) {
    Fl::get_mouse(&local_34,&local_38);
    Fl::screen_xywh(&local_3c,&local_40,&local_44,&local_48,local_34,local_38);
    (*(f->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
              (f,(ulong)(uint)((local_44 - (f->super_Fl_Group).super_Fl_Widget.w_) / 2 + local_3c),
               (ulong)(uint)((local_48 - (f->super_Fl_Group).super_Fl_Widget.h_) / 2 + local_40));
  }
  if ((place & 0x40U) != 0) {
    Fl_Window::fullscreen(f);
  }
  if ((place & 0x14U) != 0) {
    uVar6 = (f->super_Fl_Group).super_Fl_Widget.x_;
    if ((int)uVar6 < 0) {
      iVar4 = Fl::w();
      uVar6 = ~(f->super_Fl_Group).super_Fl_Widget.w_ + iVar4 +
              (f->super_Fl_Group).super_Fl_Widget.x_;
    }
    uVar5 = (f->super_Fl_Group).super_Fl_Widget.y_;
    if ((int)uVar5 < 0) {
      iVar4 = Fl::h();
      uVar3 = (f->super_Fl_Group).super_Fl_Widget.h_;
      uVar5 = ~uVar3 + iVar4 + (f->super_Fl_Group).super_Fl_Widget.y_;
    }
    else {
      uVar3 = (f->super_Fl_Group).super_Fl_Widget.h_;
    }
    (*(f->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
              (f,(ulong)uVar6,(ulong)uVar5,(ulong)(uint)(f->super_Fl_Group).super_Fl_Widget.w_,
               (ulong)uVar3);
  }
  if ((place & 0xfffffff7U) == 0) {
    puVar1 = &(f->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 & 0xef;
    if (place != 0) goto LAB_0020efc8;
  }
  else if (((uint)place >> 0xe & 1) == 0) goto LAB_0020efc8;
  if ((f->super_Fl_Group).resizable_ == (Fl_Widget *)0x0) {
    (f->super_Fl_Group).resizable_ = (Fl_Widget *)f;
  }
LAB_0020efc8:
  if (initargc == 0) {
    (*(f->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(f);
  }
  else {
    Fl_Window::show(f,initargc,initargv);
    initargc = 0;
  }
  return;
}

Assistant:

void fl_show_form(Fl_Window *f,int place,int b,const char *n) {

  f->label(n);
  if (!b) f->clear_border();
  if (fl_modal_next || b==FL_TRANSIENT) {f->set_modal(); fl_modal_next = 0;}

  if (place & FL_PLACE_MOUSE) f->hotspot(f);

  if (place & FL_PLACE_CENTER) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    f->position(scr_x+(scr_w-f->w())/2, scr_y+(scr_h-f->h())/2);
  }

  if (place & FL_PLACE_FULLSCREEN)
    f->fullscreen();

  if (place & (FL_PLACE_POSITION | FL_PLACE_GEOMETRY))
    f->position(
      (f->x() < 0) ? Fl::w()-f->w()+f->x()-1 : f->x(),
      (f->y() < 0) ? Fl::h()-f->h()+f->y()-1 : f->y());

// if (place & FL_PLACE_ASPECT) {
// this is not yet implemented
// it can be done by setting size_range().

  if (place == FL_PLACE_FREE || place == FL_PLACE_SIZE)
    f->free_position();

  if (place == FL_PLACE_FREE || place & FL_FREE_SIZE)
    if (!f->resizable()) f->resizable(f);

  if (initargc) {f->show(initargc,initargv); initargc = 0;}
  else f->show();
}